

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::validate
          (CommonArgProperties<Catch::ConfigData> *this)

{
  logic_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((this->boundField).functionObj != (IArgFunction<Catch::ConfigData> *)0x0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"option not bound","");
  std::logic_error::logic_error(this_00,(string *)local_40);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool isSet() const {
                return functionObj != CLARA_NULL;
            }